

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

CVmTimeZone * CVmTimeZone::load(ZoneHashEntry *entry)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FILE *__stream;
  size_t sVar6;
  ushort *__ptr;
  CVmTimeZone *pCVar7;
  ushort local_32;
  
  while (iVar5 = *(int *)&(((ZoneHashEntryDb *)entry)->super_ZoneHashEntry).super_CVmHashEntryCI.
                          super_CVmHashEntry.field_0x24, iVar5 == 2) {
    iVar5 = (*(((ZoneHashEntryDb *)entry)->super_ZoneHashEntry).super_CVmHashEntryCI.
              super_CVmHashEntry._vptr_CVmHashEntry[3])(entry);
    entry = (ZoneHashEntry *)CONCAT44(extraout_var,iVar5);
  }
  if (iVar5 == 3) {
    pCVar7 = (CVmTimeZone *)operator_new(0x68);
    pCVar7->hashentry_ = entry;
    pCVar7->name_ = (char *)0x0;
    init(pCVar7,(EVP_PKEY_CTX *)&((ZoneHashEntryDb *)entry)->seekpos);
    return pCVar7;
  }
  if (iVar5 != 1) {
    return (CVmTimeZone *)0x0;
  }
  iVar5 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
  __stream = (FILE *)CResLoader::open_res_file
                               ((CResLoader *)CONCAT44(extraout_var_00,iVar5),"timezones.t3tz",
                                (char *)0x0,"TMZN");
  if (__stream != (FILE *)0x0) {
    __ptr = (ushort *)0x0;
    fseek(__stream,(ulong)((ZoneHashEntryDb *)entry)->seekpos,0);
    sVar6 = fread(&local_32,2,1,__stream);
    if (sVar6 == 1) {
      __ptr = (ushort *)operator_new__((ulong)local_32);
    }
    if ((__ptr == (ushort *)0x0) || (sVar6 = fread(__ptr,(ulong)local_32,1,__stream), sVar6 != 1)) {
      pCVar7 = (CVmTimeZone *)0x0;
    }
    else {
      uVar2 = __ptr[1];
      uVar3 = *__ptr;
      bVar1 = *(byte *)((long)__ptr + 5);
      uVar4 = __ptr[2];
      pCVar7 = (CVmTimeZone *)operator_new(0x68);
      CVmTimeZone(pCVar7,(ZoneHashEntryDb *)entry,(char *)(__ptr + 3),(uint)uVar3,(uint)uVar2,
                  (uint)(byte)uVar4,(uint)bVar1);
    }
    if (__ptr != (ushort *)0x0) {
      operator_delete__(__ptr);
    }
    fclose(__stream);
    return pCVar7;
  }
  return (CVmTimeZone *)0x0;
}

Assistant:

CVmTimeZone *CVmTimeZone::load(VMG_ ZoneHashEntry *entry)
{
    /* load according to the data source in the hash table entry */
    if (entry->typ == ZONE_HASH_DB)
    {
        /* it's in the database file - open the file */
        osfildef *fp = CVmTimeZoneCache::open_zoneinfo_file(vmg0_);
        if (fp == 0)
            return 0;

        /* seek to our data */
        osfseek(fp, ((ZoneHashEntryDb *)entry)->seekpos, OSFSK_SET);

        /* read the length prefix */
        char pfx[2];
        int ok = !osfrb(fp, pfx, 2);
        
        /* allocate space for the file data */
        unsigned int alo = osrp2(pfx);
        char *buf = ok ? new char[alo] : 0;
        
        /* read the file data */
        ok = buf != 0 && !osfrb(fp, buf, alo);
        
        /* decode the header */
        unsigned int trans_cnt = osrp2(buf);
        unsigned int type_cnt = osrp2(buf+2);
        unsigned int rule_cnt = osrp1(buf+4);
        unsigned int abbr_bytes = osrp1(buf+5);
        
        /* create the time zone object */
        CVmTimeZone *tz = 0;
        if (ok)
        {
            tz = new CVmTimeZone(
                (ZoneHashEntryDb *)entry,
                buf+6, trans_cnt, type_cnt, rule_cnt, abbr_bytes);
        }

        /* release resources */
        if (buf != 0)
            delete [] buf;
        osfcls(fp);

        /* return the loaded object */
        return tz;
    }
    else if (entry->typ == ZONE_HASH_LINK)
    {
        /* load from the linked object */
        return load(vmg_ entry->resolve_links());
    }
    else if (entry->typ == ZONE_HASH_SYNTH)
    {
        /* create from the zone descriptor */
        return new CVmTimeZone((ZoneHashEntrySynth *)entry);
    }
    else
    {
        /* unknown type */
        return 0;
    }
}